

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ht-spkitable.c
# Opt level: O3

int spki_table_src_remove(spki_table *spki_table,rtr_socket *socket)

{
  long lVar1;
  void *ptr;
  tommy_list ptVar2;
  tommy_list ptVar3;
  void *pvVar4;
  int iVar5;
  tommy_node_struct *ptVar6;
  tommy_list ptVar7;
  tommy_list ptVar8;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pthread_rwlock_wrlock((pthread_rwlock_t *)&spki_table->lock);
  ptVar8 = spki_table->list;
  if (ptVar8 != (tommy_list)0x0) {
    iVar5 = -1;
    do {
      ptr = ptVar8->data;
      ptVar8 = ptVar8->next;
      if (*(rtr_socket **)((long)ptr + 0x78) == socket) {
        ptVar2 = spki_table->list;
        ptVar3 = *(tommy_list *)((long)ptr + 0xa0);
        ptVar6 = *(tommy_node_struct **)((long)ptr + 0xa8);
        ptVar7 = ptVar3;
        if (ptVar3 == (tommy_list)0x0) {
          ptVar7 = ptVar2;
        }
        ptVar7->prev = ptVar6;
        if (ptVar2 == (tommy_list)((long)ptr + 0xa0)) {
          ptVar6 = (tommy_node_struct *)&spki_table->list;
        }
        ptVar6->next = ptVar3;
        if (*(long *)((long)ptr + 0xb0) == 0) goto LAB_0010d36a;
        pvVar4 = tommy_hashlin_remove_existing
                           (&spki_table->hashtable,(tommy_hashlin_node *)((long)ptr + 0x80));
        if (pvVar4 == (void *)0x0) goto LAB_0010d36a;
        lrtr_free(ptr);
      }
    } while (ptVar8 != (tommy_node_struct *)0x0);
  }
  iVar5 = 0;
LAB_0010d36a:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    pthread_rwlock_unlock((pthread_rwlock_t *)&spki_table->lock);
    return iVar5;
  }
  __stack_chk_fail();
}

Assistant:

int spki_table_src_remove(struct spki_table *spki_table, const struct rtr_socket *socket)
{
	struct key_entry *entry;
	tommy_node *current_node;

	pthread_rwlock_wrlock(&spki_table->lock);

	current_node = tommy_list_head(&spki_table->list);
	while (current_node) {
		entry = current_node->data;
		if (entry->socket == socket) {
			current_node = current_node->next;
			if (!tommy_list_remove_existing(&spki_table->list, &entry->list_node)) {
				pthread_rwlock_unlock(&spki_table->lock);
				return SPKI_ERROR;
			}
			if (!tommy_hashlin_remove_existing(&spki_table->hashtable, &entry->hash_node)) {
				pthread_rwlock_unlock(&spki_table->lock);
				return SPKI_ERROR;
			}
			lrtr_free(entry);
		} else {
			current_node = current_node->next;
		}
	}
	pthread_rwlock_unlock(&spki_table->lock);
	return SPKI_SUCCESS;
}